

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmn_live.c
# Opt level: O3

void cmn_live(cmn_t *cmn,mfcc_t **incep,int32 varnorm,int32 nfr)

{
  int iVar1;
  float *pfVar2;
  mfcc_t *pmVar3;
  mfcc_t *pmVar4;
  ulong uVar5;
  long lVar6;
  long lVar7;
  
  if (nfr < 1) {
    return;
  }
  if (varnorm != 0) {
    err_msg(ERR_FATAL,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/cmn_live.c"
            ,0x9a,"Variance normalization not implemented in live mode decode\n");
    exit(1);
  }
  uVar5 = 0;
  do {
    pfVar2 = (float *)incep[uVar5];
    if (0.0 < *pfVar2 || *pfVar2 == 0.0) {
      iVar1 = cmn->veclen;
      if (0 < (long)iVar1) {
        pmVar3 = cmn->cmn_mean;
        pmVar4 = cmn->sum;
        lVar7 = 0;
        do {
          pmVar4[lVar7] = (mfcc_t)(pfVar2[lVar7] + (float)pmVar4[lVar7]);
          pfVar2[lVar7] = pfVar2[lVar7] - (float)pmVar3[lVar7];
          lVar7 = lVar7 + 1;
        } while (iVar1 != lVar7);
      }
      cmn->nframe = cmn->nframe + 1;
    }
    uVar5 = uVar5 + 1;
  } while (uVar5 != (uint)nfr);
  if (cmn->nframe < 0x321) {
    return;
  }
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/cmn_live.c"
          ,0x58,"Update from < ");
  if (0 < cmn->veclen) {
    lVar7 = 0;
    do {
      err_msg(ERR_INFOCONT,(char *)0x0,0,"%5.2f ",(double)(float)cmn->cmn_mean[lVar7]);
      lVar7 = lVar7 + 1;
    } while (lVar7 < cmn->veclen);
  }
  err_msg(ERR_INFOCONT,(char *)0x0,0,">\n");
  iVar1 = cmn->nframe;
  lVar7 = (long)cmn->veclen;
  if (lVar7 < 1) {
    if (iVar1 < 800) goto LAB_00116977;
  }
  else {
    pmVar3 = cmn->cmn_mean;
    pmVar4 = cmn->sum;
    lVar6 = 0;
    do {
      pmVar3[lVar6] = (mfcc_t)((float)pmVar4[lVar6] / (float)iVar1);
      lVar6 = lVar6 + 1;
    } while (lVar7 != lVar6);
    if (iVar1 < 800) goto LAB_00116977;
    lVar6 = 0;
    do {
      pmVar4[lVar6] = (mfcc_t)((float)pmVar4[lVar6] * (1.0 / (float)iVar1) * 500.0);
      lVar6 = lVar6 + 1;
    } while (lVar7 != lVar6);
  }
  cmn->nframe = 500;
LAB_00116977:
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]sphinxtrain/src/libs/libsphinxbase/feat/cmn_live.c"
          ,0x69,"Update to   < ");
  if (0 < cmn->veclen) {
    lVar7 = 0;
    do {
      err_msg(ERR_INFOCONT,(char *)0x0,0,"%5.2f ",(double)(float)cmn->cmn_mean[lVar7]);
      lVar7 = lVar7 + 1;
    } while (lVar7 < cmn->veclen);
  }
  err_msg(ERR_INFOCONT,(char *)0x0,0,">\n");
  return;
}

Assistant:

void
cmn_live(cmn_t *cmn, mfcc_t **incep, int32 varnorm, int32 nfr)
{
    int32 i, j;

    if (nfr <= 0)
        return;

    if (varnorm)
        E_FATAL
            ("Variance normalization not implemented in live mode decode\n");

    for (i = 0; i < nfr; i++) {

	/* Skip zero energy frames */
	if (incep[i][0] < 0)
	    continue;

        for (j = 0; j < cmn->veclen; j++) {
            cmn->sum[j] += incep[i][j];
            incep[i][j] -= cmn->cmn_mean[j];
        }

        ++cmn->nframe;
    }

    /* Shift buffer down if we have more than CMN_WIN_HWM frames */
    if (cmn->nframe > CMN_WIN_HWM)
        cmn_live_shiftwin(cmn);
}